

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# certificate_policies_unittest.cc
# Opt level: O3

void __thiscall
bssl::anon_unknown_0::ParseCertificatePoliciesExtensionOidsTest_OnePolicyWithCustomQualifier_Test::
TestBody(ParseCertificatePoliciesExtensionOidsTest_OnePolicyWithCustomQualifier_Test *this)

{
  Input extension_value;
  bool bVar1;
  ParamType *pPVar2;
  pointer *__ptr;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar3;
  char *in_R9;
  vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> policies;
  CertErrors errors;
  string der;
  AssertHelper local_b8;
  undefined1 local_b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  undefined1 local_a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  AssertHelper local_80;
  undefined1 local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_70;
  pointer local_68;
  CertErrors local_58;
  string local_40;
  
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_a0 = (undefined1  [8])&local_90;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a0,"policy_1_2_3_with_custom_qualifier.pem","");
  LoadTestData((anon_unknown_0 *)local_78,(string *)local_a0,&local_40);
  if (local_a0 != (undefined1  [8])&local_90) {
    operator_delete((void *)local_a0,local_90._M_allocated_capacity + 1);
  }
  if (local_78[0] == (anon_unknown_0)0x0) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a0,(internal *)local_78,
               (AssertionResult *)"LoadTestData(\"policy_1_2_3_with_custom_qualifier.pem\", &der)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/certificate_policies_unittest.cc"
               ,0x88,(char *)local_a0);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
    if (local_a0 != (undefined1  [8])&local_90) {
      operator_delete((void *)local_a0,local_90._M_allocated_capacity + 1);
    }
    if (local_58.nodes_.super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_58.nodes_.
                            super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
    if (pbStack_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      ::std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_70,pbStack_70);
    }
    goto LAB_002150b4;
  }
  if (pbStack_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    ::std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_70,pbStack_70);
  }
  local_78 = (undefined1  [8])0x0;
  pbStack_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_68 = (pointer)0x0;
  CertErrors::CertErrors(&local_58);
  extension_value.data_.size_ = local_40._M_string_length;
  extension_value.data_.data_ = (uchar *)local_40._M_dataplus._M_p;
  pPVar2 = testing::WithParamInterface<bool>::GetParam();
  bVar1 = ParseCertificatePoliciesExtensionOids
                    (extension_value,*pPVar2,
                     (vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *)local_78,
                     &local_58);
  pPVar2 = testing::WithParamInterface<bool>::GetParam();
  if (*pPVar2 == true) {
    local_b0[0] = !bVar1;
    local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_a8;
      testing::Message::Message((Message *)&local_b8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_a0,(internal *)local_b0,(AssertionResult *)0x54296d,"true","false",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/certificate_policies_unittest.cc"
                 ,0x90,(char *)local_a0);
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_b8);
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      if (local_a0 != (undefined1  [8])&local_90) {
        operator_delete((void *)local_a0,local_90._M_allocated_capacity + 1);
      }
      if ((long *)CONCAT44(local_b8.data_._4_4_,local_b8.data_._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_b8.data_._4_4_,local_b8.data_._0_4_) + 8))();
      }
      local_98 = local_a8;
      if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      goto LAB_0021508e;
    }
  }
  else {
    local_b0[0] = bVar1;
    local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!bVar1) {
      testing::Message::Message((Message *)&local_b8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_a0,(internal *)local_b0,(AssertionResult *)0x54296d,"false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/certificate_policies_unittest.cc"
                 ,0x92,(char *)local_a0);
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_b8);
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      if (local_a0 != (undefined1  [8])&local_90) {
        operator_delete((void *)local_a0,local_90._M_allocated_capacity + 1);
      }
      if ((long *)CONCAT44(local_b8.data_._4_4_,local_b8.data_._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_b8.data_._4_4_,local_b8.data_._0_4_) + 8))();
      }
      if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        ::std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a8,local_a8);
      }
    }
    local_b8.data_._0_4_ = 1;
    local_b0 = (undefined1  [8])((long)pbStack_70 - (long)local_78 >> 4);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_a0,"1U","policies.size()",(uint *)&local_b8,
               (unsigned_long *)local_b0);
    if (local_a0[0] == (string)0x0) {
      testing::Message::Message((Message *)local_b0);
      if (local_98 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (local_98->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_b8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/certificate_policies_unittest.cc"
                 ,0x93,pcVar3);
      testing::internal::AssertHelper::operator=(&local_b8,(Message *)local_b0);
LAB_00215067:
      testing::internal::AssertHelper::~AssertHelper(&local_b8);
      if (local_b0 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_b0 + 8))();
      }
    }
    else {
      if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        ::std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_98,local_98);
      }
      local_b0 = (undefined1  [8])&(anonymous_namespace)::policy_1_2_3_der;
      local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
      testing::internal::CmpHelperEQ<bssl::der::Input,bssl::der::Input>
                ((internal *)local_a0,"der::Input(policy_1_2_3_der)","policies[0]",(Input *)local_b0
                 ,(Input *)local_78);
      if (local_a0[0] == (string)0x0) {
        testing::Message::Message((Message *)local_b0);
        if (local_98 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = (local_98->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/certificate_policies_unittest.cc"
                   ,0x94,pcVar3);
        testing::internal::AssertHelper::operator=(&local_b8,(Message *)local_b0);
        goto LAB_00215067;
      }
    }
    if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_98;
LAB_0021508e:
      ::std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(this_00,local_98);
    }
  }
  CertErrors::~CertErrors(&local_58);
  if (local_78 != (undefined1  [8])0x0) {
    operator_delete((void *)local_78,(long)local_68 - (long)local_78);
  }
LAB_002150b4:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                             local_40.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

TEST_P(ParseCertificatePoliciesExtensionOidsTest, TwoPolicies) {
  std::string der;
  ASSERT_TRUE(LoadTestData("policy_1_2_3_and_1_2_4.pem", &der));
  std::vector<der::Input> policies;
  CertErrors errors;
  EXPECT_TRUE(ParseCertificatePoliciesExtensionOids(
      StringAsBytes(der), fail_parsing_unknown_qualifier_oids(), &policies,
      &errors));
  ASSERT_EQ(2U, policies.size());
  EXPECT_EQ(der::Input(policy_1_2_3_der), policies[0]);
  EXPECT_EQ(der::Input(policy_1_2_4_der), policies[1]);
}